

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureSpecCase::renderTex
          (TextureSpecCase *this,Surface *dst,deUint32 program,int width,int height)

{
  int program_00;
  Context *ctx;
  Vector<float,_3> local_4c;
  Vector<float,_3> local_40;
  float local_34;
  float local_30;
  float h;
  float w;
  int targetH;
  int targetW;
  int height_local;
  int width_local;
  deUint32 program_local;
  Surface *dst_local;
  TextureSpecCase *this_local;
  
  targetH = height;
  targetW = width;
  height_local = program;
  _width_local = dst;
  dst_local = (Surface *)this;
  w = (float)sglr::ContextWrapper::getWidth(&this->super_ContextWrapper);
  h = (float)sglr::ContextWrapper::getHeight(&this->super_ContextWrapper);
  local_30 = (float)targetW / (float)(int)w;
  local_34 = (float)targetH / (float)(int)h;
  ctx = sglr::ContextWrapper::getCurrentContext(&this->super_ContextWrapper);
  program_00 = height_local;
  tcu::Vector<float,_3>::Vector(&local_40,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_4c,local_30 + local_30 + -1.0,local_34 + local_34 + -1.0,0.0)
  ;
  sglr::drawQuad(ctx,program_00,&local_40,&local_4c);
  readPixels(this,_width_local,0,0,targetW,targetH);
  return;
}

Assistant:

void TextureSpecCase::renderTex (tcu::Surface& dst, deUint32 program, int width, int height)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	sglr::drawQuad(*getCurrentContext(), program, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}